

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O3

void mqtt_client_clear_xio(MQTT_CLIENT_HANDLE handle)

{
  if (handle != (MQTT_CLIENT_HANDLE)0x0) {
    handle->xioHandle = (XIO_HANDLE)0x0;
  }
  return;
}

Assistant:

void mqtt_client_clear_xio(MQTT_CLIENT_HANDLE handle)
{
    if (handle != NULL)
    {
        MQTT_CLIENT *mqtt_client = (MQTT_CLIENT *)handle;

        // The upstream transport handle allocates and deallocates the xio handle.
        // The reference to that xio handle is shared between this layer (mqtt layer)
        // and the upstream layer. The clearing done here is to signal to this layer
        // that the handle is no longer available to be used. This is different from
        // deiniting the mqtt client in that we do not want an entire teardown, but
        // only a possible re-upping of the xio in the future.
        mqtt_client->xioHandle = NULL;
    }
}